

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_RbTree.h
# Opt level: O0

void __thiscall
axl::sl::
RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
::onInsert(RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
           *this,Node *x)

{
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *pRVar1;
  int iVar2;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *in_RSI;
  BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
  *in_RDI;
  bool bVar3;
  Node *y_1;
  Node *y;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *local_10;
  
  in_RSI->m_color = RbColor_Red;
  local_10 = in_RSI;
  while( true ) {
    bVar3 = false;
    if (local_10 != in_RDI->m_root) {
      bVar3 = ((local_10->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
               ).m_parent)->m_color == RbColor_Red;
    }
    if (!bVar3) break;
    if ((local_10->
        super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
        ).m_parent ==
        (((((local_10->
            super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
            ).m_parent)->
          super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
          ).m_parent)->
        super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
        ).m_left) {
      pRVar1 = (((((local_10->
                   super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                   ).m_parent)->
                 super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                 ).m_parent)->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
               ).m_right;
      iVar2 = RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>::getColor(pRVar1);
      if (iVar2 == 1) {
        ((local_10->
         super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
         ).m_parent)->m_color = RbColor_Black;
        pRVar1->m_color = RbColor_Black;
        ((((local_10->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_parent)->
         super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
         ).m_parent)->m_color = RbColor_Red;
        local_10 = (((local_10->
                     super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                     ).m_parent)->
                   super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                   ).m_parent;
      }
      else {
        if (local_10 ==
            (((local_10->
              super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
              ).m_parent)->
            super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
            ).m_right) {
          local_10 = (local_10->
                     super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                     ).m_parent;
          BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
          ::rotateLeft(in_RDI,local_10);
        }
        ((local_10->
         super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
         ).m_parent)->m_color = RbColor_Black;
        ((((local_10->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_parent)->
         super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
         ).m_parent)->m_color = RbColor_Red;
        BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
        ::rotateRight(in_RDI,(((local_10->
                               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                               ).m_parent)->
                             super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                             ).m_parent);
      }
    }
    else {
      pRVar1 = (((((local_10->
                   super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                   ).m_parent)->
                 super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                 ).m_parent)->
               super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
               ).m_left;
      iVar2 = RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>::getColor(pRVar1);
      if (iVar2 == 1) {
        ((local_10->
         super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
         ).m_parent)->m_color = RbColor_Black;
        pRVar1->m_color = RbColor_Black;
        ((((local_10->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_parent)->
         super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
         ).m_parent)->m_color = RbColor_Red;
        local_10 = (((local_10->
                     super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                     ).m_parent)->
                   super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                   ).m_parent;
      }
      else {
        if (local_10 ==
            (((local_10->
              super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
              ).m_parent)->
            super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
            ).m_left) {
          local_10 = (local_10->
                     super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                     ).m_parent;
          BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
          ::rotateRight(in_RDI,local_10);
        }
        ((local_10->
         super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
         ).m_parent)->m_color = RbColor_Black;
        ((((local_10->
           super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
           ).m_parent)->
         super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
         ).m_parent)->m_color = RbColor_Red;
        BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_const_axl::spy::ThreadState::Frame_&>
        ::rotateLeft(in_RDI,(((local_10->
                              super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                              ).m_parent)->
                            super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
                            ).m_parent);
      }
    }
  }
  in_RDI->m_root->m_color = RbColor_Black;
  return;
}

Assistant:

void
	onInsert(Node* x) {
		x->m_color = RbColor_Red; // make new node red

		// check Red-Black properties
		while (x != this->m_root && x->m_parent->m_color == RbColor_Red) {
			// we have a violation
			if (x->m_parent == x->m_parent->m_parent->m_left) {
				Node *y = x->m_parent->m_parent->m_right;
				if (Node::getColor(y) == RbColor_Red) {
					// uncle is red
					x->m_parent->m_color = RbColor_Black;
					y->m_color = RbColor_Black;
					x->m_parent->m_parent->m_color = RbColor_Red;
					x = x->m_parent->m_parent;
				} else {
					// uncle is black
					if (x == x->m_parent->m_right) {
						// make x a m_pLeft child
						x = x->m_parent;
						this->rotateLeft(x);
					}

					// recolor and rotate
					x->m_parent->m_color = RbColor_Black;
					x->m_parent->m_parent->m_color = RbColor_Red;
					this->rotateRight(x->m_parent->m_parent);
				}
			} else {
				// mirror image of above code
				Node *y = x->m_parent->m_parent->m_left;
				if (Node::getColor(y) == RbColor_Red) {
					// uncle is red
					x->m_parent->m_color = RbColor_Black;
					y->m_color = RbColor_Black;
					x->m_parent->m_parent->m_color = RbColor_Red;
					x = x->m_parent->m_parent;
				} else {
					// uncle is black
					if (x == x->m_parent->m_left) {
						x = x->m_parent;
						this->rotateRight(x);
					}

					x->m_parent->m_color = RbColor_Black;
					x->m_parent->m_parent->m_color = RbColor_Red;
					this->rotateLeft(x->m_parent->m_parent);
				}
			}
		}

		this->m_root->m_color = RbColor_Black;

	#if (_AXL_SL_RBTREE_ASSERT_VALID)
		assertValid();
	#endif
	}